

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_test.c
# Opt level: O1

void * yajlTestRealloc(void *ctx,void *ptr,size_t sz)

{
  void *pvVar1;
  
  if (ptr == (void *)0x0) {
    ctx = (void *)((long)ctx + 4);
  }
  else if (sz != 0) goto LAB_0010266f;
  *(int *)ctx = *ctx + 1;
LAB_0010266f:
  pvVar1 = realloc(ptr,sz);
  return pvVar1;
}

Assistant:

static void * yajlTestRealloc(void * ctx, void * ptr, size_t sz)
{
    if (ptr == NULL) {
        assert(sz != 0);
        TEST_CTX(ctx)->numMallocs++;
    } else if (sz == 0) {
        TEST_CTX(ctx)->numFrees++;
    }

    return realloc(ptr, sz);
}